

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  FastText *pFVar1;
  bool bVar2;
  char cVar3;
  int64_t iVar4;
  invalid_argument *this;
  shared_ptr<fasttext::FastText> fasttext;
  Autotune autotune;
  string outputFileName;
  ofstream ofs;
  Args a;
  FastText *local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  _Any_data local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448 [5];
  string local_3f8;
  _Any_data local_3d8;
  code *local_3c8;
  undefined8 uStack_3c0;
  long *local_3b8;
  filebuf local_3b0 [8];
  long local_3a8 [29];
  ios_base local_2c0 [264];
  Args local_1b8;
  
  ::fasttext::Args::Args(&local_1b8);
  ::fasttext::Args::parseArgs(&local_1b8,args);
  local_468 = (FastText *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::FastText,std::allocator<fasttext::FastText>>
            (&local_460,&local_468,(allocator<fasttext::FastText> *)&local_3b8);
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  bVar2 = ::fasttext::Args::hasAutotune(&local_1b8);
  if (bVar2) {
    iVar4 = ::fasttext::Args::getAutotuneModelSize(&local_1b8);
    if (iVar4 != -1) {
      local_3b8 = local_3a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b8,local_1b8.output._M_dataplus._M_p,
                 local_1b8.output._M_dataplus._M_p + local_1b8.output._M_string_length);
      std::__cxx11::string::append((char *)&local_3b8);
      goto LAB_0013c5d6;
    }
  }
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b8,local_1b8.output._M_dataplus._M_p,
             local_1b8.output._M_dataplus._M_p + local_1b8.output._M_string_length);
  std::__cxx11::string::append((char *)&local_3b8);
LAB_0013c5d6:
  std::__cxx11::string::operator=((string *)&local_3f8,(string *)&local_3b8);
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8,local_3a8[0] + 1);
  }
  std::ofstream::ofstream(&local_3b8,(string *)&local_3f8,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::ofstream::close();
    bVar2 = ::fasttext::Args::hasAutotune(&local_1b8);
    if (bVar2) {
      ::fasttext::Autotune::Autotune((Autotune *)&local_458,local_468);
      local_3c8 = (code *)0x0;
      uStack_3c0 = 0;
      local_3d8._M_unused._M_object = (void *)0x0;
      local_3d8._8_8_ = 0;
      ::fasttext::Autotune::train((Autotune *)&local_458,&local_1b8,(AutotuneCallback *)&local_3d8);
      if (local_3c8 != (code *)0x0) {
        (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
      }
      ::fasttext::Autotune::~Autotune((Autotune *)&local_458);
    }
    else {
      local_448[0]._M_allocated_capacity = (code *)0x0;
      local_448[0]._8_8_ = 0;
      local_458._M_unused._M_object = (void *)0x0;
      local_458._8_8_ = 0;
      ::fasttext::FastText::train(local_468,&local_1b8,(TrainCallback *)&local_458);
      if ((code *)local_448[0]._0_8_ != (code *)0x0) {
        (*(code *)local_448[0]._0_8_)(&local_458,&local_458,3);
      }
    }
    ::fasttext::FastText::saveModel(local_468,&local_3f8);
    pFVar1 = local_468;
    local_458._M_unused._M_object = local_448;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_458,local_1b8.output._M_dataplus._M_p,
               local_1b8.output._M_dataplus._M_p + local_1b8.output._M_string_length);
    std::__cxx11::string::append(local_458._M_pod_data);
    ::fasttext::FastText::saveVectors(pFVar1,(string *)&local_458);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_unused._0_8_ != local_448) {
      operator_delete(local_458._M_unused._M_object,(ulong)(local_448[0]._M_allocated_capacity + 1))
      ;
    }
    pFVar1 = local_468;
    if (local_1b8.saveOutput == true) {
      local_458._M_unused._M_object = local_448;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,local_1b8.output._M_dataplus._M_p,
                 local_1b8.output._M_dataplus._M_p + local_1b8.output._M_string_length);
      std::__cxx11::string::append(local_458._M_pod_data);
      ::fasttext::FastText::saveOutput(pFVar1,(string *)&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_unused._0_8_ != local_448) {
        operator_delete(local_458._M_unused._M_object,
                        (ulong)(local_448[0]._M_allocated_capacity + 1));
      }
    }
    local_3b8 = _VTT;
    *(undefined8 *)(local_3b0 + _VTT[-3] + -8) = _log;
    std::filebuf::~filebuf(local_3b0);
    std::ios_base::~ios_base(local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                               local_3f8.field_2._M_local_buf[0]) + 1);
    }
    if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
    }
    ::fasttext::Args::~Args(&local_1b8);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_458,
                 &local_3f8," cannot be opened for saving.");
  std::invalid_argument::invalid_argument(this,(string *)local_458._M_pod_data);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  std::shared_ptr<FastText> fasttext = std::make_shared<FastText>();
  std::string outputFileName;

  if (a.hasAutotune() &&
      a.getAutotuneModelSize() != Args::kUnlimitedModelSize) {
    outputFileName = a.output + ".ftz";
  } else {
    outputFileName = a.output + ".bin";
  }
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  if (a.hasAutotune()) {
    Autotune autotune(fasttext.get());
    autotune.train(a);
  } else {
    fasttext->train(a);
  }
  fasttext->saveModel(outputFileName);
  fasttext->saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext->saveOutput(a.output + ".output");
  }
}